

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAnneal.c
# Opt level: O1

int cuddAnnealing(DdManager *table,int lower,int upper)

{
  uint uVar1;
  DdHalfWord x_low;
  int iVar2;
  int iVar3;
  DdHalfWord x_high;
  DdHalfWord y;
  DdHalfWord x;
  int iVar4;
  int iVar5;
  int iVar6;
  void *__dest;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  DdNode *pDVar10;
  DdNode *pDVar11;
  int iVar12;
  int iVar13;
  DdHalfWord y_00;
  DdHalfWord DVar14;
  DdNode *moves;
  DdHalfWord DVar15;
  int iVar16;
  int iVar17;
  DdHalfWord DVar18;
  long lVar19;
  double dVar20;
  double dVar21;
  double __x;
  int local_9c;
  
  iVar3 = cuddSifting(table,lower,upper);
  iVar17 = 0;
  if (iVar3 != 0) {
    iVar17 = (upper - lower) + 1;
    uVar1 = table->keys;
    iVar3 = table->isolated;
    __dest = malloc((long)iVar17 << 2);
    if (__dest == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
LAB_007bc879:
      iVar17 = 0;
    }
    else {
      iVar3 = uVar1 - iVar3;
      lVar19 = (long)lower;
      if (lower <= upper) {
        memcpy(__dest,table->invperm + lVar19,(ulong)((upper - lower) + 1) << 2);
      }
      local_9c = iVar17 * 0xf;
      __x = (double)iVar3 * 0.6;
      iVar16 = iVar3 + 0x1e;
      iVar5 = iVar3 + 10;
      iVar6 = iVar3 + 0x14;
      iVar12 = iVar3;
      iVar13 = iVar3;
      while ((iVar2 = iVar13, iVar13 = iVar16, dVar21 = __x, 1.0 < dVar21 ||
             (iVar5 != iVar13 || (iVar5 != iVar2 || iVar5 != iVar6)))) {
        if (0 < local_9c) {
          iVar16 = 0;
          iVar5 = iVar3;
          do {
            uVar7 = Cudd_Random();
            do {
              uVar8 = Cudd_Random();
              iVar12 = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff)
                            % (long)iVar17);
              iVar3 = (int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) %
                           (long)iVar17);
            } while (iVar12 == iVar3);
            x_high = iVar12 + lower;
            x_low = iVar3 + lower;
            if (iVar12 <= iVar3) {
              x_low = x_high;
              x_high = iVar3 + lower;
            }
            lVar9 = Cudd_Random();
            if ((double)lVar9 / 2147483561.0 < 0.4) {
              y = cuddNextHigh(table,x_low);
              x = cuddNextLow(table,x_high);
              iVar12 = table->keys - table->isolated;
              moves = (DdNode *)0x0;
              iVar3 = iVar12;
              DVar14 = x_low;
              y_00 = x_high;
              while( true ) {
                DVar18 = y;
                DVar15 = y_00;
                if (y == x) {
                  iVar4 = cuddSwapInPlace(table,DVar14,y);
                  if ((iVar4 == 0) ||
                     (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
                  goto LAB_007bc5fa;
                  pDVar10->index = DVar14;
                  pDVar10->ref = y;
                  *(int *)((long)&pDVar10->next + 4) = iVar4;
                  (pDVar10->type).kids.T = moves;
                  iVar4 = cuddSwapInPlace(table,x,y_00);
                  moves = pDVar10;
                  if ((iVar4 == 0) ||
                     (pDVar11 = cuddDynamicAllocNode(table), pDVar11 == (DdNode *)0x0))
                  goto LAB_007bc5fa;
                  pDVar11->index = x;
                  pDVar11->ref = y_00;
                  *(int *)((long)&pDVar11->next + 4) = iVar4;
                  (pDVar11->type).kids.T = pDVar10;
                  iVar4 = cuddSwapInPlace(table,DVar14,y);
                  moves = pDVar11;
                  if ((iVar4 == 0) ||
                     (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
                  goto LAB_007bc5fa;
                  pDVar10->index = DVar14;
                  moves = pDVar10;
                  y_00 = DVar14;
                }
                else {
                  iVar4 = cuddSwapInPlace(table,DVar14,y);
                  if (DVar14 == x) {
                    if ((iVar4 == 0) ||
                       (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
                    goto LAB_007bc5fa;
                    pDVar10->index = DVar14;
                    pDVar11 = moves;
                    moves = pDVar10;
                    y_00 = DVar14;
                  }
                  else {
                    if ((iVar4 == 0) ||
                       (pDVar11 = cuddDynamicAllocNode(table), pDVar11 == (DdNode *)0x0))
                    goto LAB_007bc5fa;
                    pDVar11->index = DVar14;
                    pDVar11->ref = y;
                    *(int *)((long)&pDVar11->next + 4) = iVar4;
                    (pDVar11->type).kids.T = moves;
                    iVar4 = cuddSwapInPlace(table,x,y_00);
                    moves = pDVar11;
                    if ((iVar4 == 0) ||
                       (pDVar10 = cuddDynamicAllocNode(table), pDVar10 == (DdNode *)0x0))
                    goto LAB_007bc5fa;
                    pDVar10->index = x;
                    moves = pDVar10;
                    DVar18 = y_00;
                    DVar15 = y;
                    y_00 = x;
                  }
                }
                moves->ref = DVar18;
                *(int *)((long)&moves->next + 4) = iVar4;
                (moves->type).kids.T = pDVar11;
                y = cuddNextHigh(table,DVar15);
                x = cuddNextLow(table,y_00);
                if (((int)x_high < (int)y) || ((double)iVar3 * 1.1 < (double)iVar4)) break;
                DVar14 = DVar15;
                if (iVar4 < iVar3) {
                  iVar3 = iVar4;
                }
              }
              if ((int)x < (int)x_low) {
LAB_007bc6f3:
                iVar3 = siftBackwardProb(table,(Move *)moves,iVar12,dVar21);
                if (iVar3 != 0) {
                  pDVar10 = table->nextFree;
                  do {
                    pDVar11 = moves;
                    moves = (pDVar11->type).kids.T;
                    pDVar11->ref = 0;
                    pDVar11->next = pDVar10;
                    pDVar10 = pDVar11;
                  } while (moves != (DdNode *)0x0);
                  table->nextFree = pDVar11;
                  iVar3 = 1;
                  goto LAB_007bc62f;
                }
              }
              else {
                iVar3 = cuddSwapInPlace(table,x,y_00);
                if ((iVar3 != 0) &&
                   (pDVar10 = cuddDynamicAllocNode(table), pDVar10 != (DdNode *)0x0)) {
                  pDVar10->index = x;
                  pDVar10->ref = y_00;
                  *(int *)((long)&pDVar10->next + 4) = iVar3;
                  (pDVar10->type).kids.T = moves;
                  moves = pDVar10;
                  goto LAB_007bc6f3;
                }
              }
LAB_007bc5fa:
              iVar3 = 0;
              if (moves != (DdNode *)0x0) {
                pDVar10 = table->nextFree;
                do {
                  pDVar11 = moves;
                  moves = (pDVar11->type).kids.T;
                  pDVar11->ref = 0;
                  pDVar11->next = pDVar10;
                  pDVar10 = pDVar11;
                } while (moves != (DdNode *)0x0);
                table->nextFree = pDVar11;
              }
            }
            else {
              DVar14 = x_low;
              if ((double)lVar9 / 2147483561.0 < 0.76) {
                DVar14 = x_high;
              }
              iVar3 = ddJumpingAux(table,DVar14,x_low,x_high,dVar21);
            }
LAB_007bc62f:
            if (iVar3 == 0) {
              free(__dest);
              goto LAB_007bc879;
            }
            iVar12 = table->keys - table->isolated;
            iVar3 = iVar5;
            if (iVar12 < iVar5) {
              iVar3 = iVar12;
            }
            if ((lower <= upper) && (iVar12 < iVar5)) {
              memcpy(__dest,table->invperm + lVar19,(ulong)((upper - lower) + 1) << 2);
              iVar3 = iVar12;
            }
            iVar16 = iVar16 + 1;
            iVar5 = iVar3;
          } while (iVar16 != local_9c);
        }
        __x = dVar21 * 0.9;
        iVar16 = iVar12;
        iVar5 = iVar6;
        iVar6 = iVar2;
        if (1.0 <= __x) {
          dVar20 = log(__x);
          dVar21 = log(dVar21);
          local_9c = (int)((double)local_9c * (dVar20 / dVar21));
        }
      }
      iVar17 = 1;
      if (lower <= upper) {
        uVar7 = 0;
        do {
          iVar3 = table->perm[*(int *)((long)__dest + uVar7 * 4)];
          iVar5 = cuddNextLow(table,iVar3);
          while ((long)(uVar7 + lVar19) <= (long)iVar5) {
            iVar3 = cuddSwapInPlace(table,iVar5,iVar3);
            if (iVar3 == 0) {
              iVar17 = 0;
              goto LAB_007bc902;
            }
            iVar6 = cuddNextLow(table,iVar5);
            iVar3 = iVar5;
            iVar5 = iVar6;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != (upper - lower) + 1);
      }
LAB_007bc902:
      free(__dest);
    }
  }
  return iVar17;
}

Assistant:

int
cuddAnnealing(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         nvars;
    int         size;
    int         x,y;
    int         result;
    int         c1, c2, c3, c4;
    int         BestCost;
    int         *BestOrder;
    double      NewTemp, temp;
    double      rand1;
    int         innerloop, maxGen;
    int         ecount, ucount, dcount;
   
    nvars = upper - lower + 1;

    result = cuddSifting(table,lower,upper);
#ifdef DD_STATS
    (void) fprintf(table->out,"\n");
#endif
    if (result == 0) return(0);

    size = table->keys - table->isolated;

    /* Keep track of the best order. */
    BestCost = size;
    BestOrder = ABC_ALLOC(int,nvars);
    if (BestOrder == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    copyOrder(table,BestOrder,lower,upper);

    temp = BETA * size;
    maxGen = (int) (MAXGEN_RATIO * nvars);

    c1 = size + 10;
    c2 = c1 + 10;
    c3 = size;
    c4 = c2 + 10;
    ecount = ucount = dcount = 0;
 
    while (!stopping_criterion(c1, c2, c3, c4, temp)) {
#ifdef DD_STATS
        (void) fprintf(table->out,"temp=%f\tsize=%d\tgen=%d\t",
                       temp,size,maxGen);
        tosses = acceptances = 0;
#endif
        for (innerloop = 0; innerloop < maxGen; innerloop++) {
            /* Choose x, y  randomly. */
            x = (int) Cudd_Random() % nvars;
            do {
                y = (int) Cudd_Random() % nvars;
            } while (x == y);
            x += lower;
            y += lower;
            if (x > y) {
                int tmp = x;
                x = y;
                y = tmp;
            }

            /* Choose move with roulette wheel. */
            rand1 = random_generator();
            if (rand1 < EXC_PROB) {
                result = ddExchange(table,x,y,temp);       /* exchange */
                ecount++;
#if 0
                (void) fprintf(table->out,
                               "Exchange of %d and %d: size = %d\n",
                               x,y,table->keys - table->isolated);
#endif
            } else if (rand1 < EXC_PROB + JUMP_UP_PROB) {
                result = ddJumpingAux(table,y,x,y,temp); /* jumping_up */
                ucount++;
#if 0
                (void) fprintf(table->out,
                               "Jump up of %d to %d: size = %d\n",
                               y,x,table->keys - table->isolated);
#endif
            } else {
                result = ddJumpingAux(table,x,x,y,temp); /* jumping_down */
                dcount++;
#if 0
                (void) fprintf(table->out,
                               "Jump down of %d to %d: size = %d\n",
                               x,y,table->keys - table->isolated);
#endif
            }

            if (!result) {
                ABC_FREE(BestOrder);
                return(0);
            }

            size = table->keys - table->isolated;       /* keep current size */
            if (size < BestCost) {                      /* update best order */
                BestCost = size;
                copyOrder(table,BestOrder,lower,upper);
            }
        }
        c1 = c2;
        c2 = c3;
        c3 = c4;
        c4 = size;
        NewTemp = ALPHA * temp;
        if (NewTemp >= 1.0) {
            maxGen = (int)(log(NewTemp) / log(temp) * maxGen);
        }
        temp = NewTemp;                 /* control variable */
#ifdef DD_STATS
        (void) fprintf(table->out,"uphill = %d\taccepted = %d\n",
                       tosses,acceptances);
        fflush(table->out);
#endif
    }

    result = restoreOrder(table,BestOrder,lower,upper);
    ABC_FREE(BestOrder);
    if (!result) return(0);
#ifdef DD_STATS
    fprintf(table->out,"#:N_EXCHANGE %8d : total exchanges\n",ecount);
    fprintf(table->out,"#:N_JUMPUP   %8d : total jumps up\n",ucount);
    fprintf(table->out,"#:N_JUMPDOWN %8d : total jumps down",dcount);
#endif
    return(1);

}